

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkCore.c
# Opt level: O1

int Lpk_ResynthesizeNode(Lpk_Man_t *p)

{
  int *piVar1;
  Vec_Ptr_t *pVVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint *pTruth;
  Kit_DsdNtk_t *pNtk;
  ulong uVar7;
  long lVar8;
  long lVar9;
  Lpk_Cut_t *pCut;
  ulong uVar10;
  Lpk_Cut_t *pLVar11;
  timespec ts;
  timespec local_48;
  Lpk_Cut_t *local_38;
  
  iVar3 = clock_gettime(3,&local_48);
  if (iVar3 < 0) {
    lVar8 = 1;
  }
  else {
    lVar8 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
    lVar8 = ((lVar8 >> 7) - (lVar8 >> 0x3f)) + local_48.tv_sec * -1000000;
  }
  iVar3 = Lpk_NodeCuts(p);
  if (iVar3 == 0) {
    iVar3 = clock_gettime(3,&local_48);
    if (iVar3 < 0) {
      lVar9 = -1;
    }
    else {
      lVar9 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
    }
    p->timeCuts = p->timeCuts + lVar9 + lVar8;
    iVar3 = 0;
  }
  else {
    iVar3 = clock_gettime(3,&local_48);
    if (iVar3 < 0) {
      lVar9 = -1;
    }
    else {
      lVar9 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
    }
    p->timeCuts = p->timeCuts + lVar9 + lVar8;
    if (p->pPars->fVeryVerbose != 0) {
      printf("Node %5d : Mffc size = %5d. Cuts = %5d.\n",(ulong)(uint)p->pObj->Id,
             (ulong)(uint)p->nMffc,(ulong)(uint)p->nEvals);
    }
    p->nCutsTotal = p->nCutsTotal + p->nCuts;
    p->nCutsUseful = p->nCutsUseful + p->nEvals;
    iVar3 = 1;
    if (0 < p->nEvals) {
      pLVar11 = p->pCuts;
      uVar10 = 0;
      local_38 = pLVar11;
      do {
        if ((uVar10 == 1) && (p->pPars->fFirst != 0)) break;
        pCut = pLVar11 + p->pEvals[uVar10];
        if ((undefined1  [212])((undefined1  [212])*pCut & (undefined1  [212])0x3f) !=
            (undefined1  [212])0x0) {
          pVVar2 = p->pNtk->vObjs;
          uVar7 = 0;
          do {
            iVar3 = pCut->pLeaves[uVar7];
            if (((long)iVar3 < 0) || (pVVar2->nSize <= iVar3)) goto LAB_00486fa6;
            piVar1 = (int *)((long)pVVar2->pArray[iVar3] + 0x2c);
            *piVar1 = *piVar1 + 1;
            uVar7 = uVar7 + 1;
          } while (uVar7 < (*(uint *)pCut & 0x3f));
        }
        iVar3 = Abc_NodeMffcLabel(p->pObj);
        uVar4 = *(uint *)pCut;
        if ((uVar4 & 0x3f) != 0) {
          pVVar2 = p->pNtk->vObjs;
          uVar7 = 0;
          do {
            iVar6 = pCut->pLeaves[uVar7];
            if (((long)iVar6 < 0) || (pVVar2->nSize <= iVar6)) {
LAB_00486fa6:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            piVar1 = (int *)((long)pVVar2->pArray[iVar6] + 0x2c);
            *piVar1 = *piVar1 + -1;
            uVar7 = uVar7 + 1;
            uVar4 = *(uint *)pCut;
          } while (uVar7 < (uVar4 & 0x3f));
        }
        if (iVar3 == (uVar4 >> 6 & 0x3f) - (uVar4 >> 0xc & 0x3f)) {
          iVar3 = clock_gettime(3,&local_48);
          if (iVar3 < 0) {
            lVar8 = 1;
          }
          else {
            lVar8 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
            lVar8 = ((lVar8 >> 7) - (lVar8 >> 0x3f)) + local_48.tv_sec * -1000000;
          }
          pTruth = Lpk_CutTruth(p,pCut,0);
          uVar4 = Extra_TruthSupportSize(pTruth,*(uint *)pCut & 0x3f);
          iVar3 = clock_gettime(3,&local_48);
          if (iVar3 < 0) {
            lVar9 = -1;
          }
          else {
            lVar9 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
          }
          p->timeTruth = p->timeTruth + lVar9 + lVar8;
          pNtk = Kit_DsdDecompose(pTruth,*(uint *)pCut & 0x3f);
          uVar5 = (uint)(pNtk->Root >> 1);
          if ((uint)pNtk->nNodes + (uint)pNtk->nVars <= uVar5) {
            __assert_fail("Id >= 0 && Id < pNtk->nVars + pNtk->nNodes",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kit.h"
                          ,0x99,"Kit_DsdObj_t *Kit_DsdNtkObj(Kit_DsdNtk_t *, int)");
          }
          if (((uint)*pNtk->pNodes[(ulong)uVar5 - (ulong)pNtk->nVars] & 0xfc000000) != 0x40000000) {
            iVar6 = Kit_DsdNonDsdSizeMax(pNtk);
            iVar3 = p->pPars->nLutSize;
            if ((iVar6 <= iVar3) ||
               ((int)uVar4 <=
                (int)((iVar3 + -1) *
                     ((~*(uint *)pCut >> 0xc | 0xffffffc0) + (*(uint *)pCut >> 6 & 0x3f))))) {
              if (p->pPars->fVeryVerbose != 0) {
                uVar5 = *(uint *)pCut;
                printf("  C%02d: L= %2d/%2d  V= %2d/%d  N= %d  W= %4.2f  ",(double)pCut->Weight,
                       uVar10 & 0xffffffff,(ulong)(uVar5 & 0x3f),(ulong)uVar4,
                       (ulong)(uVar5 >> 6 & 0x3f),(ulong)(uVar5 >> 0xc & 0x3f),uVar5 >> 0x12 & 0x3f)
                ;
                Kit_DsdPrint(_stdout,pNtk);
                Kit_DsdPrintFromTruth(pTruth,*(uint *)pCut & 0x3f);
              }
              iVar3 = clock_gettime(3,&local_48);
              if (iVar3 < 0) {
                lVar8 = 1;
              }
              else {
                lVar8 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
                lVar8 = ((lVar8 >> 7) - (lVar8 >> 0x3f)) + local_48.tv_sec * -1000000;
              }
              iVar3 = Lpk_ExploreCut(p,pCut,pNtk);
              iVar6 = clock_gettime(3,&local_48);
              if (iVar6 < 0) {
                lVar9 = -1;
              }
              else {
                lVar9 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
              }
              p->timeEval = p->timeEval + lVar9 + lVar8;
              Kit_DsdNtkFree(pNtk);
              pLVar11 = local_38;
              if (iVar3 == 0) goto LAB_00486f6d;
              break;
            }
          }
          Kit_DsdNtkFree(pNtk);
          pLVar11 = local_38;
        }
LAB_00486f6d:
        uVar10 = uVar10 + 1;
      } while ((long)uVar10 < (long)p->nEvals);
      iVar3 = 1;
    }
  }
  return iVar3;
}

Assistant:

int Lpk_ResynthesizeNode( Lpk_Man_t * p )
{
//    static int Count = 0;
    Kit_DsdNtk_t * pDsdNtk;
    Lpk_Cut_t * pCut;
    unsigned * pTruth;
    int i, k, nSuppSize, nCutNodes, RetValue;
    abctime clk;

    // compute the cuts
clk = Abc_Clock();
    if ( !Lpk_NodeCuts( p ) )
    {
p->timeCuts += Abc_Clock() - clk;
        return 0;
    }
p->timeCuts += Abc_Clock() - clk;

//return 0;

    if ( p->pPars->fVeryVerbose )
    printf( "Node %5d : Mffc size = %5d. Cuts = %5d.\n", p->pObj->Id, p->nMffc, p->nEvals );
    // try the good cuts
    p->nCutsTotal  += p->nCuts;
    p->nCutsUseful += p->nEvals;
    for ( i = 0; i < p->nEvals; i++ )
    {
        // get the cut
        pCut = p->pCuts + p->pEvals[i];
        if ( p->pPars->fFirst && i == 1 )
            break;

        // skip bad cuts        
//        printf( "Mffc size = %d.  ", Abc_NodeMffcLabel(p->pObj) );
        for ( k = 0; k < (int)pCut->nLeaves; k++ )
            Abc_NtkObj(p->pNtk, pCut->pLeaves[k])->vFanouts.nSize++;
        nCutNodes = Abc_NodeMffcLabel(p->pObj);
//        printf( "Mffc with cut = %d.  ", nCutNodes );
        for ( k = 0; k < (int)pCut->nLeaves; k++ )
            Abc_NtkObj(p->pNtk, pCut->pLeaves[k])->vFanouts.nSize--;
//        printf( "Mffc cut = %d.  ", (int)pCut->nNodes - (int)pCut->nNodesDup );
//        printf( "\n" );
        if ( nCutNodes != (int)pCut->nNodes - (int)pCut->nNodesDup )
            continue;

        // compute the truth table
clk = Abc_Clock();
        pTruth = Lpk_CutTruth( p, pCut, 0 );
        nSuppSize = Extra_TruthSupportSize(pTruth, pCut->nLeaves);
p->timeTruth += Abc_Clock() - clk;

        pDsdNtk = Kit_DsdDecompose( pTruth, pCut->nLeaves ); 
//        Kit_DsdVerify( pDsdNtk, pTruth, pCut->nLeaves ); 
        // skip 16-input non-DSD because ISOP will not work
        if ( Kit_DsdNtkRoot(pDsdNtk)->nFans == 16 ) 
        {
            Kit_DsdNtkFree( pDsdNtk );
            continue;
        }

        // if DSD has nodes that require splitting to fit them into LUTs
        // we can skip those cuts that cannot lead to improvement
        // (a full DSD network requires  V = Nmin * (K-1) + 1 for improvement)
        if ( Kit_DsdNonDsdSizeMax(pDsdNtk) > p->pPars->nLutSize && 
             nSuppSize >= ((int)pCut->nNodes - (int)pCut->nNodesDup - 1) * (p->pPars->nLutSize - 1) + 1 )
        {
            Kit_DsdNtkFree( pDsdNtk );
            continue;
        }

        if ( p->pPars->fVeryVerbose )
        {
//            char * pFileName;
            printf( "  C%02d: L= %2d/%2d  V= %2d/%d  N= %d  W= %4.2f  ", 
                i, pCut->nLeaves, nSuppSize, pCut->nNodes, pCut->nNodesDup, pCut->nLuts, pCut->Weight );
            Kit_DsdPrint( stdout, pDsdNtk );
            Kit_DsdPrintFromTruth( pTruth, pCut->nLeaves );
//            pFileName = Kit_TruthDumpToFile( pTruth, pCut->nLeaves, Count++ );
//            printf( "Saved truth table in file \"%s\".\n", pFileName );
        }

        // update the network
clk = Abc_Clock();
        RetValue = Lpk_ExploreCut( p, pCut, pDsdNtk );
p->timeEval += Abc_Clock() - clk;
        Kit_DsdNtkFree( pDsdNtk );
        if ( RetValue )
            break;
    }
    return 1;
}